

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::GeneratedMessageFactory::RegisterType
          (GeneratedMessageFactory *this,Descriptor *descriptor,Message *prototype)

{
  bool bVar1;
  FileDescriptor *this_00;
  DescriptorPool *pDVar2;
  DescriptorPool *pDVar3;
  LogMessage *pLVar4;
  string *value;
  LogFinisher local_a9;
  LogMessage local_a8;
  LogFinisher local_6d [20];
  byte local_59;
  LogMessage local_58;
  Message *local_20;
  Message *prototype_local;
  Descriptor *descriptor_local;
  GeneratedMessageFactory *this_local;
  
  local_20 = prototype;
  prototype_local = (Message *)descriptor;
  descriptor_local = (Descriptor *)this;
  this_00 = Descriptor::file(descriptor);
  pDVar2 = FileDescriptor::pool(this_00);
  pDVar3 = DescriptorPool::generated_pool();
  local_59 = 0;
  if (pDVar2 != pDVar3) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x131);
    local_59 = 1;
    pLVar4 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: (descriptor->file()->pool()) == (DescriptorPool::generated_pool()): "
                       );
    pLVar4 = internal::LogMessage::operator<<
                       (pLVar4,
                        "Tried to register a non-generated type with the generated type registry.");
    internal::LogFinisher::operator=(local_6d,pLVar4);
  }
  if ((local_59 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_58);
  }
  internal::Mutex::AssertHeld(&this->mutex_);
  bVar1 = InsertIfNotPresent<google::protobuf::hash_map<google::protobuf::Descriptor_const*,google::protobuf::Message_const*,google::protobuf::hash<google::protobuf::Descriptor_const*>,std::equal_to<google::protobuf::Descriptor_const*>,std::allocator<std::pair<google::protobuf::Descriptor_const*const,google::protobuf::Message_const*>>>>
                    (&this->type_map_,(first_type *)&prototype_local,&local_20);
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
               ,0x13a);
    pLVar4 = internal::LogMessage::operator<<(&local_a8,"Type is already registered: ");
    value = Descriptor::full_name_abi_cxx11_((Descriptor *)prototype_local);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=(&local_a9,pLVar4);
    internal::LogMessage::~LogMessage(&local_a8);
  }
  return;
}

Assistant:

void GeneratedMessageFactory::RegisterType(const Descriptor* descriptor,
                                           const Message* prototype) {
  GOOGLE_DCHECK_EQ(descriptor->file()->pool(), DescriptorPool::generated_pool())
    << "Tried to register a non-generated type with the generated "
       "type registry.";

  // This should only be called as a result of calling a file registration
  // function during GetPrototype(), in which case we already have locked
  // the mutex.
  mutex_.AssertHeld();
  if (!InsertIfNotPresent(&type_map_, descriptor, prototype)) {
    GOOGLE_LOG(DFATAL) << "Type is already registered: " << descriptor->full_name();
  }
}